

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>::SelectNth
          (MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL> *this,
          SubFrames *frames,idx_t n)

{
  pointer puVar1;
  size_type sVar2;
  value_type vVar3;
  bool bVar4;
  ulong *puVar5;
  ulong uVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  ulong *puVar9;
  vector<unsigned_long,_true> *this_00;
  const_reference pvVar10;
  pointer pFVar11;
  ulong *puVar12;
  pointer pFVar13;
  pointer pFVar14;
  ulong uVar15;
  long lVar16;
  ulong *puVar17;
  size_type __n;
  pointer puVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  long *plVar22;
  ulong *puVar23;
  ulong uVar24;
  size_type sVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  unsigned_long uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  pair<unsigned_long,_unsigned_long> pVar32;
  array<std::pair<unsigned_long,_unsigned_long>,_3UL> cascades;
  array<std::pair<unsigned_long,_unsigned_long>,_3UL> matches;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar20 = ((long)(this->tree).
                  super_vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                  .
                  super__Vector_base<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->tree).
                  super_vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                  .
                  super__Vector_base<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  if (uVar20 < 2) {
    uVar20 = 0;
LAB_017aeaad:
    uVar29 = 0;
    uVar6 = uVar20;
  }
  else {
    __n = uVar20 - 2;
    if (__n == 0) {
      uVar20 = 0;
    }
    else {
      uVar27 = 1;
      uVar6 = __n;
      do {
        uVar27 = uVar27 << 5;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
      if (2 < __n) {
        local_78 = (undefined1  [16])0x0;
        local_88 = (undefined1  [16])0x0;
        local_98 = (undefined1  [16])0x0;
        pvVar7 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                 ::operator[](&this->tree,uVar20 - 1);
        if ((frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
            super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
            super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
            super__Vector_impl_data._M_start) {
          sVar25 = 0;
          do {
            pvVar8 = vector<duckdb::FrameBounds,_true>::operator[](frames,sVar25);
            puVar17 = (pvVar7->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar20 = (long)(pvVar7->first).
                           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)puVar17 >> 3;
            puVar9 = puVar17;
            if ((long)uVar20 < 1) {
              *(ulong *)(local_98 + sVar25 * 0x10) = 0;
            }
            else {
              puVar23 = puVar17;
              uVar6 = uVar20;
              do {
                uVar24 = uVar6 >> 1;
                uVar6 = ~uVar24 + uVar6;
                puVar12 = puVar23 + uVar24 + 1;
                if (pvVar8->start <= puVar23[uVar24]) {
                  uVar6 = uVar24;
                  puVar12 = puVar23;
                }
                puVar23 = puVar12;
              } while (0 < (long)uVar6);
              *(ulong *)(local_98 + sVar25 * 0x10) =
                   (long)puVar23 - (long)puVar17 >> 3 & 0xffffffffffffffe0;
              do {
                uVar6 = uVar20 >> 1;
                uVar20 = ~uVar6 + uVar20;
                puVar23 = puVar9 + uVar6 + 1;
                if (pvVar8->end <= puVar9[uVar6]) {
                  uVar20 = uVar6;
                  puVar23 = puVar9;
                }
                puVar9 = puVar23;
              } while (0 < (long)uVar20);
            }
            *(ulong *)(local_98 + sVar25 * 0x10 + 8) =
                 (long)puVar9 - (long)puVar17 >> 3 & 0xffffffffffffffe0;
            sVar25 = sVar25 + 1;
          } while (sVar25 < (ulong)((long)(frames->
                                          super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                          ).
                                          super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(frames->
                                          super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                          ).
                                          super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4));
        }
        uVar20 = 0;
        uVar6 = __n;
LAB_017aec01:
        pvVar7 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                 ::operator[](&this->tree,uVar6 + 1);
        this_00 = &pvVar7->second;
        pvVar7 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                 ::operator[](&this->tree,uVar6);
        auVar31._8_4_ = 0xffffffff;
        auVar31._0_8_ = 0xffffffffffffffff;
        auVar31._12_4_ = 0xffffffff;
        puVar1 = (pvVar7->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pFVar11 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pFVar14 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        do {
          local_48 = (undefined1  [16])0x0;
          local_58 = (undefined1  [16])0x0;
          local_68 = (undefined1  [16])0x0;
          if (pFVar14 == pFVar11) {
            uVar24 = 0;
            uVar28 = 0;
            pFVar14 = pFVar11;
          }
          else {
            uVar28 = 0;
            sVar25 = 0;
            do {
              pvVar8 = vector<duckdb::FrameBounds,_true>::operator[](frames,sVar25);
              lVar16 = sVar25 * 0x10;
              sVar2 = *(size_type *)(local_98 + lVar16);
              pvVar10 = vector<unsigned_long,_true>::operator[](this_00,sVar2);
              vVar3 = *pvVar10;
              puVar18 = puVar1 + vVar3;
              pvVar10 = vector<unsigned_long,_true>::operator[](this_00,sVar2 + 0x20);
              uVar24 = *pvVar10 - vVar3;
              if (uVar24 != 0 && (long)vVar3 <= (long)*pvVar10) {
                do {
                  uVar15 = uVar24 >> 1;
                  uVar21 = ~uVar15 + uVar24;
                  uVar24 = uVar15;
                  if ((puVar18 + uVar15 + 1)[0xffffffffffffffff] < pvVar8->start) {
                    puVar18 = puVar18 + uVar15 + 1;
                    uVar24 = uVar21;
                  }
                } while (0 < (long)uVar24);
              }
              lVar26 = (long)puVar18 - (long)puVar1 >> 3;
              *(long *)(local_68 + lVar16) = lVar26;
              sVar2 = *(size_type *)(local_98 + lVar16 + 8);
              pvVar10 = vector<unsigned_long,_true>::operator[](this_00,sVar2);
              vVar3 = *pvVar10;
              puVar18 = puVar1 + vVar3;
              pvVar10 = vector<unsigned_long,_true>::operator[](this_00,sVar2 + 0x20);
              uVar24 = *pvVar10 - vVar3;
              if (uVar24 != 0 && (long)vVar3 <= (long)*pvVar10) {
                do {
                  uVar15 = uVar24 >> 1;
                  uVar21 = ~uVar15 + uVar24;
                  uVar24 = uVar15;
                  if ((puVar18 + uVar15 + 1)[0xffffffffffffffff] < pvVar8->end) {
                    puVar18 = puVar18 + uVar15 + 1;
                    uVar24 = uVar21;
                  }
                } while (0 < (long)uVar24);
              }
              auVar31._8_4_ = 0xffffffff;
              auVar31._0_8_ = 0xffffffffffffffff;
              auVar31._12_4_ = 0xffffffff;
              lVar19 = (long)puVar18 - (long)puVar1 >> 3;
              *(long *)(local_68 + lVar16 + 8) = lVar19;
              uVar28 = (uVar28 - lVar26) + lVar19;
              sVar25 = sVar25 + 1;
              pFVar11 = (frames->
                        super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                        super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pFVar14 = (frames->
                        super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                        super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              uVar24 = (long)pFVar14 - (long)pFVar11 >> 4;
            } while (sVar25 < uVar24);
            if (n < uVar28) goto LAB_017aee45;
          }
          if (uVar24 != 0) {
            plVar22 = (long *)local_98;
            do {
              *plVar22 = *plVar22 - auVar31._0_8_;
              plVar22[1] = plVar22[1] - auVar31._8_8_;
              plVar22 = plVar22 + 2;
              uVar24 = uVar24 - 1;
            } while (uVar24 != 0);
          }
          uVar20 = uVar20 + 1;
          n = n - uVar28;
        } while( true );
      }
      uVar20 = 0;
      do {
        pvVar7 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                 ::operator[](&this->tree,__n);
        puVar17 = (pvVar7->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar27 * uVar20;
        if (puVar17 + uVar27 <
            (pvVar7->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pFVar14 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                    ).super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pFVar11 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                    ).super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          puVar9 = puVar17 + uVar27;
          do {
            puVar23 = puVar9;
            pFVar13 = pFVar14;
            if (pFVar11 == pFVar13) {
              uVar6 = 0;
              pFVar14 = pFVar13;
            }
            else {
              uVar6 = 0;
              sVar25 = 0;
              do {
                pvVar8 = vector<duckdb::FrameBounds,_true>::operator[](frames,sVar25);
                puVar9 = puVar17;
                if (uVar27 != 0) {
                  uVar24 = uVar27;
                  do {
                    uVar28 = uVar24 >> 1;
                    uVar24 = ~uVar28 + uVar24;
                    puVar12 = puVar9 + uVar28 + 1;
                    if (pvVar8->start <= puVar9[uVar28]) {
                      uVar24 = uVar28;
                      puVar12 = puVar9;
                    }
                    puVar9 = puVar12;
                  } while (0 < (long)uVar24);
                }
                uVar24 = (long)puVar23 - (long)puVar9 >> 3;
                puVar12 = puVar9;
                if (0 < (long)uVar24) {
                  do {
                    uVar28 = uVar24 >> 1;
                    uVar24 = ~uVar28 + uVar24;
                    puVar5 = puVar12 + uVar28 + 1;
                    if (pvVar8->end <= puVar12[uVar28]) {
                      uVar24 = uVar28;
                      puVar5 = puVar12;
                    }
                    puVar12 = puVar5;
                  } while (0 < (long)uVar24);
                }
                uVar6 = uVar6 + ((long)puVar12 - (long)puVar9 >> 3);
                sVar25 = sVar25 + 1;
                pFVar14 = (frames->
                          super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                          super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pFVar13 = (frames->
                          super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                          super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              } while (sVar25 < (ulong)((long)pFVar13 - (long)pFVar14 >> 4));
              if (n < uVar6) break;
            }
            uVar20 = uVar20 + 1;
            n = n - uVar6;
            pFVar11 = pFVar13;
            puVar9 = puVar23 + uVar27;
            puVar17 = puVar23;
          } while (puVar23 + uVar27 <
                   (pvVar7->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
        uVar20 = uVar20 << 5;
        uVar27 = uVar27 >> 5;
        __n = __n - 1;
joined_r0x017aeea3:
      } while (__n != 0);
    }
    pvVar7 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
             ::operator[](&this->tree,0);
    puVar1 = (pvVar7->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar29 = n + 1;
    pvVar7 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
             ::operator[](&this->tree,0);
    uVar27 = (long)(pvVar7->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pvVar7->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    if (uVar20 + 0x20 < uVar27) {
      uVar27 = uVar20 + 0x20;
    }
    uVar6 = uVar20;
    if (uVar20 < uVar27) {
      pFVar14 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pFVar11 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      do {
        if (pFVar14 != pFVar11) {
          uVar6 = puVar1[uVar20];
          pFVar13 = pFVar14;
          do {
            uVar29 = uVar29 - (uVar6 < pFVar13->end && pFVar13->start <= uVar6);
            pFVar13 = pFVar13 + 1;
          } while (pFVar13 != pFVar11);
        }
        if (uVar29 == 0) goto LAB_017aeaad;
        uVar20 = uVar20 + 1;
        uVar6 = uVar27;
      } while (uVar20 != uVar27);
    }
  }
  pVar32.second = uVar29;
  pVar32.first = uVar6;
  return pVar32;
LAB_017aee45:
  if (pFVar14 != pFVar11) {
    auVar30._8_4_ = (int)uVar20;
    auVar30._0_8_ = uVar20;
    auVar30._12_4_ = (int)(uVar20 >> 0x20);
    lVar16 = 0;
    do {
      uVar28 = *(ulong *)(local_68 + lVar16 + 8);
      *(ulong *)(local_98 + lVar16) =
           (*(ulong *)(local_68 + lVar16) & 0xffffffffffffffe0) + uVar20 * 0x40;
      *(ulong *)(local_98 + lVar16 + 8) = (uVar28 & 0xffffffffffffffe0) + auVar30._8_8_ * 0x40;
      lVar16 = lVar16 + 0x10;
      uVar24 = uVar24 - 1;
    } while (uVar24 != 0);
  }
  uVar20 = uVar20 << 5;
  uVar27 = uVar27 >> 5;
  __n = uVar6 - 1;
  bVar4 = uVar6 < 3;
  uVar6 = __n;
  if (bVar4) goto joined_r0x017aeea3;
  goto LAB_017aec01;
}

Assistant:

pair<idx_t, idx_t> MergeSortTree<E, O, CMP, F, C>::SelectNth(const SubFrames &frames, idx_t n) const {
	// Handle special case of a one-element tree
	if (tree.size() < 2) {
		return {0, 0};
	}

	// 	The first level contains a single run,
	//	so the only thing we need is any cascading pointers
	auto level_no = tree.size() - 2;
	idx_t level_width = 1;
	for (idx_t i = 0; i < level_no; ++i) {
		level_width *= FANOUT;
	}

	// Find Nth element in a top-down traversal
	idx_t result = 0;

	// First, handle levels with cascading pointers
	const auto min_cascaded = LowestCascadingLevel();
	if (level_no > min_cascaded) {
		//	Initialise the cascade indicies from the previous level
		using CascadeRange = pair<idx_t, idx_t>;
		std::array<CascadeRange, 3> cascades;
		const auto &level = tree[level_no + 1].first;
		for (idx_t f = 0; f < frames.size(); ++f) {
			const auto &frame = frames[f];
			auto &cascade_idx = cascades[f];
			const auto lower_idx =
			    UnsafeNumericCast<idx_t>(std::lower_bound(level.begin(), level.end(), frame.start) - level.begin());
			cascade_idx.first = lower_idx / CASCADING * FANOUT;
			const auto upper_idx =
			    UnsafeNumericCast<idx_t>(std::lower_bound(level.begin(), level.end(), frame.end) - level.begin());
			cascade_idx.second = upper_idx / CASCADING * FANOUT;
		}

		// 	Walk the cascaded levels
		for (; level_no >= min_cascaded; --level_no) {
			//	The cascade indicies into this level are in the previous level
			const auto &level_cascades = tree[level_no + 1].second;

			// Go over all children until we found enough in range
			const auto *level_data = tree[level_no].first.data();
			while (true) {
				idx_t matched = 0;
				std::array<CascadeRange, 3> matches;
				for (idx_t f = 0; f < frames.size(); ++f) {
					const auto &frame = frames[f];
					auto &cascade_idx = cascades[f];
					auto &match = matches[f];

					const auto lower_begin = level_data + level_cascades[cascade_idx.first];
					const auto lower_end = level_data + level_cascades[cascade_idx.first + FANOUT];
					match.first =
					    UnsafeNumericCast<idx_t>(std::lower_bound(lower_begin, lower_end, frame.start) - level_data);

					const auto upper_begin = level_data + level_cascades[cascade_idx.second];
					const auto upper_end = level_data + level_cascades[cascade_idx.second + FANOUT];
					match.second =
					    UnsafeNumericCast<idx_t>(std::lower_bound(upper_begin, upper_end, frame.end) - level_data);

					matched += idx_t(match.second - match.first);
				}
				if (matched > n) {
					// 	Too much in this level, so move down to leftmost child candidate within the cascade range
					for (idx_t f = 0; f < frames.size(); ++f) {
						auto &cascade_idx = cascades[f];
						auto &match = matches[f];
						cascade_idx.first = (match.first / CASCADING + 2 * result) * FANOUT;
						cascade_idx.second = (match.second / CASCADING + 2 * result) * FANOUT;
					}
					break;
				}

				//	Not enough in this child, so move right
				for (idx_t f = 0; f < frames.size(); ++f) {
					auto &cascade_idx = cascades[f];
					++cascade_idx.first;
					++cascade_idx.second;
				}
				++result;
				n -= matched;
			}
			result *= FANOUT;
			level_width /= FANOUT;
		}
	}

	//	Continue with the uncascaded levels (except the first)
	for (; level_no > 0; --level_no) {
		const auto &level = tree[level_no].first;
		auto range_begin = level.begin() + UnsafeNumericCast<int64_t>(result * level_width);
		auto range_end = range_begin + UnsafeNumericCast<int64_t>(level_width);
		while (range_end < level.end()) {
			idx_t matched = 0;
			for (idx_t f = 0; f < frames.size(); ++f) {
				const auto &frame = frames[f];
				const auto lower_match = std::lower_bound(range_begin, range_end, frame.start);
				const auto upper_match = std::lower_bound(lower_match, range_end, frame.end);
				matched += idx_t(upper_match - lower_match);
			}
			if (matched > n) {
				// 	Too much in this level, so move down to leftmost child candidate
				//	Since we have no cascade pointers left, this is just the start of the next level.
				break;
			}
			//	Not enough in this child, so move right
			range_begin = range_end;
			range_end += UnsafeNumericCast<int64_t>(level_width);
			++result;
			n -= matched;
		}
		result *= FANOUT;
		level_width /= FANOUT;
	}

	// The last level
	const auto *level_data = tree[level_no].first.data();
	++n;

	const auto count = tree[level_no].first.size();
	for (const auto limit = MinValue<idx_t>(result + FANOUT, count); result < limit; ++result) {
		const auto v = level_data[result];
		for (const auto &frame : frames) {
			n -= (v >= frame.start) && (v < frame.end);
		}
		if (!n) {
			break;
		}
	}

	return {result, n};
}